

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::dec_h(CPU *this)

{
  CPU *this_local;
  
  dec_r8(this,&this->regs->h);
  return 1;
}

Assistant:

int CPU::dec_h() {
    dec_r8(regs.h);
    return 1;
}